

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreeview.cpp
# Opt level: O0

int __thiscall QTreeViewPrivate::coordinateForItem(QTreeViewPrivate *this,int item)

{
  int iVar1;
  qsizetype qVar2;
  int in_ESI;
  QTreeViewPrivate *in_RDI;
  int viewItemIndex_1;
  int viewItemCoordinate_1;
  int viewItemIndex;
  int viewItemCoordinate;
  int topViewItemIndex;
  int i;
  int y;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  int in_stack_ffffffffffffffc4;
  int local_30;
  int local_2c;
  int local_28;
  int local_24;
  int local_1c;
  int local_18;
  int local_4;
  
  if ((in_RDI->super_QAbstractItemViewPrivate).verticalScrollMode == ScrollPerPixel) {
    if ((in_RDI->uniformRowHeights & 1U) == 0) {
      local_18 = 0;
      for (local_1c = 0; qVar2 = QList<QTreeViewItem>::size(&in_RDI->viewItems), local_1c < qVar2;
          local_1c = local_1c + 1) {
        if (local_1c == in_ESI) {
          iVar1 = QAbstractSlider::value
                            ((QAbstractSlider *)CONCAT44(local_18,in_stack_ffffffffffffffb0));
          return local_18 - iVar1;
        }
        iVar1 = itemHeight(in_RDI,in_stack_ffffffffffffffc4);
        local_18 = iVar1 + local_18;
      }
      local_4 = 0;
    }
    else {
      local_4 = in_ESI * in_RDI->defaultItemHeight;
      iVar1 = QAbstractSlider::value
                        ((QAbstractSlider *)
                         CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
      local_4 = local_4 - iVar1;
    }
  }
  else {
    local_30 = QAbstractSlider::value
                         ((QAbstractSlider *)
                          CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
    if ((in_RDI->uniformRowHeights & 1U) == 0) {
      if (in_ESI < local_30) {
        local_2c = 0;
        for (; 0 < local_30; local_30 = local_30 + -1) {
          if (local_30 == in_ESI) {
            return local_2c;
          }
          iVar1 = itemHeight(in_RDI,in_stack_ffffffffffffffc4);
          local_2c = local_2c - iVar1;
        }
        local_4 = local_2c;
      }
      else {
        local_24 = 0;
        for (local_28 = local_30; qVar2 = QList<QTreeViewItem>::size(&in_RDI->viewItems),
            local_28 < qVar2; local_28 = local_28 + 1) {
          if (local_28 == in_ESI) {
            return local_24;
          }
          iVar1 = itemHeight(in_RDI,in_stack_ffffffffffffffc4);
          local_24 = iVar1 + local_24;
        }
        local_4 = local_24;
      }
    }
    else {
      local_4 = in_RDI->defaultItemHeight * (in_ESI - local_30);
    }
  }
  return local_4;
}

Assistant:

int QTreeViewPrivate::coordinateForItem(int item) const
{
    if (verticalScrollMode == QAbstractItemView::ScrollPerPixel) {
        if (uniformRowHeights)
            return (item * defaultItemHeight) - vbar->value();
        // ### optimize (maybe do like QHeaderView by letting items have startposition)
        int y = 0;
        for (int i = 0; i < viewItems.size(); ++i) {
            if (i == item)
                return y - vbar->value();
            y += itemHeight(i);
        }
    } else { // ScrollPerItem
        int topViewItemIndex = vbar->value();
        if (uniformRowHeights)
            return defaultItemHeight * (item - topViewItemIndex);
        if (item >= topViewItemIndex) {
            // search in the visible area first and continue down
            // ### slow if the item is not visible
            int viewItemCoordinate = 0;
            int viewItemIndex = topViewItemIndex;
            while (viewItemIndex < viewItems.size()) {
                if (viewItemIndex == item)
                    return viewItemCoordinate;
                viewItemCoordinate += itemHeight(viewItemIndex);
                ++viewItemIndex;
            }
            // below the last item in the view
            Q_ASSERT(false);
            return viewItemCoordinate;
        } else {
            // search the area above the viewport (used for editor widgets)
            int viewItemCoordinate = 0;
            for (int viewItemIndex = topViewItemIndex; viewItemIndex > 0; --viewItemIndex) {
                if (viewItemIndex == item)
                    return viewItemCoordinate;
                viewItemCoordinate -= itemHeight(viewItemIndex - 1);
            }
            return viewItemCoordinate;
        }
    }
    return 0;
}